

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O1

EStatusCode __thiscall
PDFHummus::DocumentContext::WriteFormForImage
          (DocumentContext *this,string *inImagePath,unsigned_long inImageIndex,
          ObjectIDType inObjectID,PDFParsingOptions *inParsingOptions)

{
  _List_node_base *p_Var1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  EHummusImageType EVar4;
  EStatusCode EVar5;
  _List_node_base *p_Var6;
  IByteReaderWithPosition *inPNGStream;
  PDFFormXObject *pPVar7;
  EStatusCode EVar8;
  allocator_type local_c1;
  ObjectIDType inObjectID_local;
  TIFFUsageParameters params;
  _List_node_base local_88;
  undefined8 local_78;
  _List_node_base local_68;
  EStatusCodeAndObjectIDTypeList local_50;
  
  inObjectID_local = inObjectID;
  EVar4 = GetImageType(this,inImagePath,inImageIndex);
  switch(EVar4) {
  case ePDF:
    params._8_8_ = params.BWTreatment.OneColor.RGBComponents + 2;
    params.GrayscaleTreatment.ZeroColor.RGBComponents[1] = '\0';
    params.GrayscaleTreatment.ZeroColor.RGBComponents[2] = '\0';
    params.GrayscaleTreatment.ZeroColor.CMYKComponents[0] = '\0';
    params.GrayscaleTreatment.ZeroColor.CMYKComponents[1] = '\0';
    params.GrayscaleTreatment.ZeroColor.CMYKComponents[2] = '\0';
    params.GrayscaleTreatment.ZeroColor.CMYKComponents[3] = '\0';
    params._30_2_ = 0;
    params.PageIndex = 1;
    params.GrayscaleTreatment._3_8_ = params._8_8_;
    p_Var6 = (_List_node_base *)operator_new(0x20);
    p_Var6[1]._M_next = (_List_node_base *)inImageIndex;
    p_Var6[1]._M_prev = (_List_node_base *)inImageIndex;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    params._24_8_ = params._24_8_ + 1;
    local_78 = 0;
    local_88._M_next = &local_88;
    local_88._M_prev = &local_88;
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,1,&inObjectID_local,
               &local_c1);
    PDFDocumentHandler::CreateFormXObjectsFromPDF
              (&local_50,&this->mPDFDocumentHandler,inImagePath,inParsingOptions,
               (PDFPageRange *)&params,ePDFPageBoxMediaBox,(double *)0x0,
               (ObjectIDTypeList *)&local_88,(ObjectIDTypeList *)&local_68);
    while (local_50.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           _M_node.super__List_node_base._M_next != (_List_node_base *)&local_50.second) {
      p_Var6 = (local_50.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl._M_node.super__List_node_base._M_next)->_M_next;
      operator_delete(local_50.second.
                      super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      _M_node.super__List_node_base._M_next,0x18);
      local_50.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      _M_node.super__List_node_base._M_next = p_Var6;
    }
    while (p_Var6 = local_88._M_next, local_68._M_next != &local_68) {
      p_Var6 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                &(local_68._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(local_68._M_next,0x18);
      local_68._M_next = p_Var6;
    }
    while (p_Var6 != &local_88) {
      p_Var1 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var6->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var6,0x18);
      p_Var6 = p_Var1;
    }
    puVar3 = (undefined8 *)params._8_8_;
    while ((uchar *)puVar3 != params.BWTreatment.OneColor.RGBComponents + 2) {
      puVar2 = (undefined8 *)*puVar3;
      operator_delete(puVar3,0x20);
      puVar3 = puVar2;
    }
    break;
  case eJPG:
    pPVar7 = JPEGImageHandler::CreateFormXObjectFromJPGFile
                       (&this->mJPEGImageHandler,inImagePath,inObjectID_local);
    local_50.first = -(uint)(pPVar7 == (PDFFormXObject *)0x0);
    if (pPVar7 != (PDFFormXObject *)0x0) {
      PDFFormXObject::~PDFFormXObject(pPVar7);
      operator_delete(pPVar7,0x1f0);
    }
    break;
  case eTIFF:
    TIFFUsageParameters::TIFFUsageParameters(&params);
    params.PageIndex = (uint)inImageIndex;
    pPVar7 = TIFFImageHandler::CreateFormXObjectFromTIFFFile
                       (&this->mTIFFImageHandler,inImagePath,inObjectID_local,&params);
    if (pPVar7 != (PDFFormXObject *)0x0) {
      PDFFormXObject::~PDFFormXObject(pPVar7);
      operator_delete(pPVar7,0x1f0);
    }
    CMYKRGBColor::~CMYKRGBColor(&params.GrayscaleTreatment.ZeroColor);
    CMYKRGBColor::~CMYKRGBColor(&params.GrayscaleTreatment.OneColor);
    CMYKRGBColor::~CMYKRGBColor(&params.BWTreatment.OneColor);
    local_50.first = -(uint)(pPVar7 == (PDFFormXObject *)0x0);
    break;
  case ePNG:
    InputFile::InputFile((InputFile *)&params);
    EVar5 = InputFile::OpenFile((InputFile *)&params,inImagePath);
    EVar8 = eFailure;
    if (EVar5 == eSuccess) {
      inPNGStream = InputFile::GetInputStream((InputFile *)&params);
      pPVar7 = PNGImageHandler::CreateFormXObjectFromPNGStream
                         (&this->mPNGImageHandler,inPNGStream,inObjectID_local);
      EVar8 = -(uint)(pPVar7 == (PDFFormXObject *)0x0);
      if (pPVar7 != (PDFFormXObject *)0x0) {
        PDFFormXObject::~PDFFormXObject(pPVar7);
        operator_delete(pPVar7,0x1f0);
      }
    }
    InputFile::~InputFile((InputFile *)&params);
    local_50.first = EVar8;
    break;
  default:
    local_50.first = eFailure;
  }
  return local_50.first;
}

Assistant:

EStatusCode DocumentContext::WriteFormForImage(
	const std::string& inImagePath,
	unsigned long inImageIndex,
	ObjectIDType inObjectID,
	const PDFParsingOptions& inParsingOptions)
{
    EStatusCode status = eFailure;
    EHummusImageType imageType = GetImageType(inImagePath,inImageIndex);

    switch(imageType)
    {
        case ePDF:
        {
			PDFPageRange singlePageRange;
			singlePageRange.mType = PDFPageRange::eRangeTypeSpecific;
			singlePageRange.mSpecificRanges.push_back(ULongAndULong(inImageIndex, inImageIndex));

			status = CreateFormXObjectsFromPDF(inImagePath, inParsingOptions, singlePageRange, ePDFPageBoxMediaBox, NULL, ObjectIDTypeList(), ObjectIDTypeList(1, inObjectID)).first;
            break;
        }
        case eJPG:
        {
            PDFFormXObject* form = CreateFormXObjectFromJPGFile(inImagePath,inObjectID);
            status = (form ? eSuccess:eFailure);
            delete form;
            break;
        }
#ifndef PDFHUMMUS_NO_TIFF
		case eTIFF:
        {
            TIFFUsageParameters params;
            params.PageIndex = (unsigned int)inImageIndex;

            PDFFormXObject* form = CreateFormXObjectFromTIFFFile(inImagePath,inObjectID,params);
            status = (form ? eSuccess:eFailure);
            delete form;
            break;
        }
#endif
#ifndef PDFHUMMUS_NO_PNG
		case ePNG:
		{
			InputFile inputFile;
			if (inputFile.OpenFile(inImagePath) != eSuccess) {
				break;
			}
			PDFFormXObject* form = CreateFormXObjectFromPNGStream(inputFile.GetInputStream(), inObjectID);
			status = (form ? eSuccess : eFailure);
			delete form;
			break;
		}

		default:
        {
            status = eFailure;
        }
#endif
	}
    return status;
}